

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

bool __thiscall
GenericModel::insertColumns(GenericModel *this,int column,int count,QModelIndex *parent)

{
  int iVar1;
  
  if ((-1 < column && 0 < count) &&
     (iVar1 = (**(code **)(*(long *)this + 0x80))(this,parent), column <= iVar1)) {
    QAbstractItemModel::beginInsertColumns((QModelIndex *)this,(int)parent,column);
    GenericModelPrivate::insertColumns(this->m_dptr,column,count,parent);
    QAbstractItemModel::endInsertColumns();
    return true;
  }
  return false;
}

Assistant:

bool GenericModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (count <= 0 || column < 0 || column > columnCount(parent))
        return false;
    beginInsertColumns(parent, column, column + count - 1);
    Q_D(GenericModel);
    d->insertColumns(column, count, parent);
    endInsertColumns();
    return true;
}